

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR moveto_union(lyxp_set *set1,lyxp_set *set2)

{
  lyxp_set_type lVar1;
  lyd_node_inner *plVar2;
  lyd_node_inner *plVar3;
  bool bVar4;
  int iVar5;
  LY_ERR LVar6;
  uint uVar7;
  undefined8 uVar8;
  lyd_node_inner *plVar9;
  lyd_node *root;
  lyxp_set_node *plVar10;
  uint uVar11;
  LY_ERR LVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 uVar16;
  ulong uVar17;
  int local_44;
  
  lVar1 = set1->type;
  if (((ulong)lVar1 != 0) || (set2->type != LYXP_SET_NODE_SET)) {
    if (lVar1 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
      uVar16 = *(undefined8 *)(&DAT_00204650 + (ulong)lVar1 * 8);
    }
    else {
      uVar16 = 0;
    }
    if ((ulong)set2->type < 5) {
      uVar8 = *(undefined8 *)(&DAT_00204650 + (ulong)set2->type * 8);
    }
    else {
      uVar8 = 0;
    }
    ly_vlog(set1->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s and %s.","union"
            ,uVar16,uVar8);
    return LY_EVALID;
  }
  if (set2->used == 0) {
    return LY_SUCCESS;
  }
  if (set1->used == 0) {
    lyxp_set_free_content(set1);
    memcpy(set1,set2,0x90);
    memset(set2,0,0x90);
    return LY_SUCCESS;
  }
  iVar5 = set_sort(set1);
  if ((iVar5 != 0) || (iVar5 = set_sort(set2), iVar5 != 0)) {
    __assert_fail("!set_sort(set1) && !set_sort(set2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x1bee,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
  }
  LVar12 = LY_EINVAL;
  if (set1->type == LYXP_SET_NODE_SET) {
    bVar4 = false;
    if (set2->type != LYXP_SET_NODE_SET) goto LAB_001ae038;
    bVar4 = true;
    if (set2->used != 0) {
      if (set1->used != 0) {
        plVar2 = (lyd_node_inner *)set1->tree;
        plVar3 = (plVar2->field_0).node.parent;
        plVar9 = plVar2;
        while (plVar3 != (lyd_node_inner *)0x0) {
          plVar9 = plVar3;
          if (plVar2 == (lyd_node_inner *)0x0) {
            plVar9 = plVar2;
          }
          plVar3 = *(lyd_node_inner **)((long)&plVar9->field_0 + 0x10);
        }
        do {
          root = (lyd_node *)plVar9;
          plVar9 = (lyd_node_inner *)root->prev;
        } while (root->prev->next != (lyd_node *)0x0);
        LVar6 = set_assign_pos(set1,root,set1->root_type);
        LVar12 = LY_EINT;
        if ((LVar6 == LY_SUCCESS) &&
           (LVar6 = set_assign_pos(set2,root,set2->root_type), LVar6 == LY_SUCCESS)) {
          uVar11 = 0;
          ly_log_dbg(2,"MERGE target");
          print_set_debug(set1);
          ly_log_dbg(2,"MERGE source");
          print_set_debug(set2);
          if (set1->size - set1->used < set2->used) {
            uVar14 = set2->used + set1->used;
            set1->size = uVar14;
            plVar10 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar14 << 4);
            (set1->val).nodes = plVar10;
            if (plVar10 == (lyxp_set_node *)0x0) {
              bVar4 = false;
              LVar12 = LY_EMEM;
              ly_log(set2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "set_sorted_merge");
              goto LAB_001ae038;
            }
          }
          uVar15 = 0;
          uVar14 = 0;
          local_44 = 0;
          while( true ) {
            iVar5 = set_sort_compare((set2->val).nodes + uVar11,(set1->val).nodes + uVar15);
            if (iVar5 == 0) break;
            if (iVar5 < 0) {
              uVar14 = uVar14 + 1;
              set_insert_node_hash
                        (set1,(set2->val).nodes[uVar11].node,(set2->val).nodes[uVar11].type);
              uVar11 = uVar11 + 1;
              goto LAB_001ae175;
            }
            uVar13 = uVar15;
            if (uVar14 == 0) goto LAB_001ae16f;
            while( true ) {
              iVar5 = (int)uVar13;
              uVar15 = (ulong)((uVar14 - local_44) + iVar5);
              memmove((set1->val).nodes + uVar15,(set1->val).nodes + uVar13,
                      (ulong)(set1->used - iVar5) << 4);
              memcpy((set1->val).nodes + (uint)(iVar5 - local_44),
                     (set2->val).nodes + (uVar11 - uVar14),(ulong)uVar14 << 4);
              set1->used = set1->used + (uVar14 - local_44);
              uVar14 = 0;
              local_44 = 0;
LAB_001ae175:
              uVar7 = set2->used;
              if ((uVar11 < uVar7) && ((uint)uVar15 < set1->used)) break;
              if (uVar14 == 0 && uVar7 <= uVar11) {
                if ((set1->ht == (ly_ht *)0x0) && (3 < set1->used)) {
                  set_insert_node_hash(set1,(lyd_node *)0x0,LYXP_NODE_NONE);
                }
                LVar12 = LY_SUCCESS;
                ly_log_dbg(2,"MERGE result");
                print_set_debug(set1);
                lyxp_set_free_content(set2);
                bVar4 = true;
                goto LAB_001ae038;
              }
              if (uVar11 < uVar7) {
                uVar17 = (ulong)uVar11;
                uVar13 = uVar17 << 4 | 8;
                do {
                  set_insert_node_hash
                            (set1,*(lyd_node **)((long)(set2->val).nodes + (uVar13 - 8)),
                             *(lyxp_node_type *)((long)&((set2->val).nodes)->node + uVar13));
                  uVar17 = uVar17 + 1;
                  uVar7 = set2->used;
                  uVar13 = uVar13 + 0x10;
                } while (uVar17 < uVar7);
              }
              uVar14 = (uVar14 - uVar11) + uVar7;
              uVar13 = uVar15;
              uVar11 = uVar7;
            }
          }
          if (uVar14 != 0) {
            uVar14 = uVar14 + 1;
            local_44 = local_44 + 1;
            uVar11 = uVar11 + 1;
            uVar15 = (ulong)((int)uVar15 + 1);
            goto LAB_001ae175;
          }
          uVar11 = uVar11 + 1;
LAB_001ae16f:
          uVar15 = (ulong)((int)uVar15 + 1);
          uVar14 = 0;
          goto LAB_001ae175;
        }
        goto LAB_001adfb8;
      }
      set_fill_set(set1,set2);
      lyxp_set_free_content(set2);
    }
    LVar12 = LY_SUCCESS;
  }
  else {
LAB_001adfb8:
    bVar4 = false;
  }
LAB_001ae038:
  if (!bVar4) {
    return LVar12;
  }
  iVar5 = set_sort(set1);
  if (iVar5 == 0) {
    return LY_SUCCESS;
  }
  __assert_fail("!set_sort(set1)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x1bf5,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
}

Assistant:

static LY_ERR
moveto_union(struct lyxp_set *set1, struct lyxp_set *set2)
{
    LY_ERR rc;

    if ((set1->type != LYXP_SET_NODE_SET) || (set2->type != LYXP_SET_NODE_SET)) {
        LOGVAL(set1->ctx, LY_VCODE_XP_INOP_2, "union", print_set_type(set1), print_set_type(set2));
        return LY_EVALID;
    }

    /* set2 is empty or both set1 and set2 */
    if (!set2->used) {
        return LY_SUCCESS;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        /* dynamic memory belongs to set1 now, do not free */
        memset(set2, 0, sizeof *set2);
        return LY_SUCCESS;
    }

    /* we assume sets are sorted */
    assert(!set_sort(set1) && !set_sort(set2));

    /* sort, remove duplicates */
    rc = set_sorted_merge(set1, set2);
    LY_CHECK_RET(rc);

    /* final set must be sorted */
    assert(!set_sort(set1));

    return LY_SUCCESS;
}